

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O0

void slang::ast::UninstantiatedDefSymbol::fromSyntax
               (Compilation *compilation,CheckerInstantiationSyntax *syntax,
               ASTContext *parentContext,SmallVectorBase<const_slang::ast::Symbol_*> *results,
               SmallVectorBase<const_slang::ast::Symbol_*> *implicitNets)

{
  string_view moduleName;
  iterator ppSVar1;
  UninstantiatedDefSymbol *pUVar2;
  SmallVectorBase<const_slang::ast::Symbol_*> *in_RCX;
  bitmask<slang::ast::ASTFlags> in_RDX;
  Symbol *sym;
  iterator __end2;
  iterator __begin2;
  SmallVectorBase<const_slang::ast::Symbol_*> *__range2;
  ASTContext context;
  undefined1 in_stack_000000f0 [16];
  SmallVectorBase<const_slang::ast::Symbol_*> *in_stack_00000100;
  ASTContext *in_stack_ffffffffffffff28;
  SyntaxNode *in_stack_ffffffffffffff50;
  iterator local_a8;
  bitmask<slang::ast::ASTFlags> local_68 [9];
  SmallVectorBase<const_slang::ast::Symbol_*> *local_20;
  
  local_20 = in_RCX;
  bitmask<slang::ast::ASTFlags>::bitmask(local_68,NonProcedural);
  ASTContext::resetFlags(in_stack_ffffffffffffff28,in_RDX);
  not_null<slang::syntax::NameSyntax_*>::operator->
            ((not_null<slang::syntax::NameSyntax_*> *)0x35fba3);
  slang::syntax::SyntaxNode::getLastToken(in_stack_ffffffffffffff50);
  parsing::Token::valueText((Token *)in_RDX.m_bits);
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::span
            ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)0x35fbd3);
  moduleName._M_str = (char *)syntax;
  moduleName._M_len = (size_t)parentContext;
  createUninstantiatedDefs<slang::syntax::CheckerInstantiationSyntax>
            ((Compilation *)results,(CheckerInstantiationSyntax *)implicitNets,moduleName,
             (ASTContext *)context.assertionInstance,
             (span<const_slang::ast::Expression_*const,_18446744073709551615UL>)in_stack_000000f0,
             (SmallVectorBase<const_slang::ast::Symbol_*> *)context.randomizeDetails,
             in_stack_00000100);
  local_a8 = SmallVectorBase<const_slang::ast::Symbol_*>::begin(local_20);
  ppSVar1 = SmallVectorBase<const_slang::ast::Symbol_*>::end(local_20);
  for (; local_a8 != ppSVar1; local_a8 = local_a8 + 1) {
    pUVar2 = Symbol::as<slang::ast::UninstantiatedDefSymbol>((Symbol *)0x35fc6c);
    pUVar2->mustBeChecker = true;
  }
  return;
}

Assistant:

void UninstantiatedDefSymbol::fromSyntax(Compilation& compilation,
                                         const CheckerInstantiationSyntax& syntax,
                                         const ASTContext& parentContext,
                                         SmallVectorBase<const Symbol*>& results,
                                         SmallVectorBase<const Symbol*>& implicitNets) {
    ASTContext context = parentContext.resetFlags(ASTFlags::NonProcedural);
    createUninstantiatedDefs(compilation, syntax, syntax.type->getLastToken().valueText(), context,
                             {}, results, implicitNets);

    for (auto sym : results)
        sym->as<UninstantiatedDefSymbol>().mustBeChecker = true;
}